

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_b047::Decode_InputTooShort_Test::TestBody(Decode_InputTooShort_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *in_R9;
  AssertHelper local_128;
  AssertHelper local_120;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string local_b0;
  string local_90;
  undefined1 local_70 [88];
  
  pcVar1 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"",(allocator<char> *)&gtest_ar);
  multihash::decode((ResMultihash *)local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  gtest_ar_.success_ = local_70[0x20];
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (local_70[0x20] == false) {
    testing::Message::Message((Message *)&local_128);
    std::operator<<((ostream *)&(local_128.data_)->line,"Expected an error. expected: \'");
    std::operator<<((ostream *)&(local_128.data_)->line,(string *)multihash::errTooShort_abi_cxx11_)
    ;
    std::operator<<((ostream *)&(local_128.data_)->line,"\'");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"optErr","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0xa7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    if (local_70[0x20] == false) {
      std::__throw_bad_optional_access();
    }
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar,"multihash::errTooShort","optErr.value()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               multihash::errTooShort_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                 ,0xa8,pcVar1);
      testing::internal::AssertHelper::operator=(&local_128,(Message *)&gtest_ar_);
      this_00 = &gtest_ar.message_;
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
      goto LAB_0010bdaf;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"c",(allocator<char> *)&local_128);
    multihash::decode((ResMultihash *)&gtest_ar,&local_b0);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 0x28);
    gtest_ar_._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
    std::_Tuple_impl<0ul,std::optional<multihash::Multihash>&,std::optional<std::__cxx11::string>&>
    ::_M_assign<std::optional<multihash::Multihash>,std::optional<std::__cxx11::string>>
              ((_Tuple_impl<0ul,std::optional<multihash::Multihash>&,std::optional<std::__cxx11::string>&>
                *)&gtest_ar_,
               (_Tuple_impl<0UL,_std::optional<multihash::Multihash>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gtest_ar);
    std::
    _Tuple_impl<0UL,_std::optional<multihash::Multihash>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::optional<multihash::Multihash>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_b0);
    gtest_ar_.success_ = local_70[0x20];
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_70[0x20] != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      if (local_70[0x20] == false) {
        std::__throw_bad_optional_access();
      }
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar,"multihash::errTooShort","optErr.value()",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multihash::errTooShort_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_128,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                   ,0xac,pcVar1);
        testing::internal::AssertHelper::operator=(&local_128,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_128);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      this_00 = &gtest_ar.message_;
      goto LAB_0010bdaf;
    }
    testing::Message::Message((Message *)&local_128);
    std::operator<<((ostream *)&(local_128.data_)->line,"Expected an error. expected: \'");
    std::operator<<((ostream *)&(local_128.data_)->line,(string *)multihash::errTooShort_abi_cxx11_)
    ;
    std::operator<<((ostream *)&(local_128.data_)->line,"\'");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"optErr","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0xab,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_128);
  }
  this_00 = &gtest_ar_.message_;
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_128);
LAB_0010bdaf:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  std::
  _Tuple_impl<0UL,_std::optional<multihash::Multihash>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::optional<multihash::Multihash>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70);
  return;
}

Assistant:

TEST(Decode, InputTooShort) {
	auto [_, optErr] = multihash::decode("");
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errTooShort << "'";
	ASSERT_EQ(multihash::errTooShort, optErr.value());

	std::tie(_, optErr) = multihash::decode("c");
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errTooShort << "'";
	ASSERT_EQ(multihash::errTooShort, optErr.value());
}